

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O0

void cuddLevelQueueDequeue(DdLevelQueue *queue,int level)

{
  DdQueueItem *item_00;
  DdQueueItem *item;
  int level_local;
  DdLevelQueue *queue_local;
  
  item_00 = (DdQueueItem *)queue->first;
  hashDelete(queue,item_00);
  if (queue->last[level] == item_00) {
    queue->last[level] = (DdQueueItem *)0x0;
  }
  queue->first = item_00->next;
  item_00->next = queue->freelist;
  queue->freelist = item_00;
  queue->size = queue->size + -1;
  return;
}

Assistant:

void
cuddLevelQueueDequeue(
  DdLevelQueue * queue,
  int  level)
{
    DdQueueItem *item = (DdQueueItem *) queue->first;

    /* Delete from the hash table. */
    hashDelete(queue,item);

    /* Since we delete from the front, if this is the last item for
    ** its level, there are no other items for the same level. */
    if (queue->last[level] == item)
        queue->last[level] = NULL;

    queue->first = item->next;
    /* Put item on the free list. */
    item->next = queue->freelist;
    queue->freelist = item;
    /* Update stats. */
    queue->size--;
    return;

}